

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddKmap.c
# Opt level: O2

void Extra_PrintKMapRelation
               (FILE *Output,DdManager *dd,DdNode *OnSet,DdNode *OffSet,int nXVars,int nYVars,
               DdNode **XVars,DdNode **YVars)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  DdNode *n;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *n_00;
  DdNode *n_01;
  uint uVar7;
  char *pcVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  bool bVar16;
  size_t sStack_a0;
  
  iVar2 = Cudd_bddLeq(dd,OnSet,(DdNode *)((ulong)OffSet ^ 1));
  if (iVar2 == 0) {
    pcVar8 = "PrintKMap(): The on-set and the off-set overlap\n";
    sStack_a0 = 0x30;
  }
  else {
    if (dd->one == OnSet) {
      pcVar8 = "PrintKMap(): Constant 1\n";
    }
    else {
      if (dd->one != OffSet) {
        if (0x14 < (uint)(nYVars + nXVars)) {
          fprintf((FILE *)Output,
                  "PrintKMap(): The number of variables is less than zero or more than %d\n",0x14);
          return;
        }
        uVar3 = 1 << ((byte)nXVars & 0x1f);
        fputc(10,(FILE *)Output);
        iVar2 = 0;
        if (0 < nXVars) {
          iVar2 = nXVars;
        }
        for (iVar14 = 0x61; iVar14 - iVar2 != 0x61; iVar14 = iVar14 + 1) {
          fputc(nYVars + iVar14,(FILE *)Output);
        }
        fwrite(" \\ ",3,1,(FILE *)Output);
        iVar10 = 0;
        iVar14 = 0;
        iVar15 = 0;
        if (0 < nYVars) {
          iVar14 = nYVars;
          iVar15 = nYVars;
        }
        while (iVar14 != 0) {
          fputc(iVar10 + 0x61,(FILE *)Output);
          iVar10 = iVar10 + 1;
          iVar14 = iVar14 + -1;
        }
        bVar1 = (byte)nYVars & 0x1f;
        uVar11 = 1 << bVar1;
        fputc(10,(FILE *)Output);
        iVar14 = nXVars + 3;
        iVar10 = 0;
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        uVar4 = 0;
        if (0 < 1 << bVar1) {
          uVar4 = uVar11;
        }
        for (; iVar12 = iVar14, iVar10 != iVar15; iVar10 = iVar10 + 1) {
          while (bVar16 = iVar12 != 0, iVar12 = iVar12 + -1, bVar16) {
            fputc(0x20,(FILE *)Output);
          }
          for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
            pcVar8 = "On1   ";
            if (((uVar9 >> 1 ^ uVar9) & 1 << (~(byte)iVar10 + (byte)nYVars & 0x1f)) == 0) {
              pcVar8 = "On0   ";
            }
            fwrite(pcVar8 + 2,4,1,(FILE *)Output);
          }
          fputc(10,(FILE *)Output);
        }
        for (iVar14 = 0; iVar14 <= nXVars; iVar14 = iVar14 + 1) {
          fputc(0x20,(FILE *)Output);
        }
        fputc(0x2b,(FILE *)Output);
        uVar11 = uVar11 - 1;
        for (uVar9 = 0; uVar4 != uVar9; uVar9 = uVar9 + 1) {
          fputc(0x2d,(FILE *)Output);
          fputc(0x2d,(FILE *)Output);
          fputc(0x2d,(FILE *)Output);
          if (uVar11 != uVar9) {
            fputc(0x2b,(FILE *)Output);
          }
        }
        fputc(0x2b,(FILE *)Output);
        fputc(10,(FILE *)Output);
        uVar9 = uVar3 - 1;
        uVar7 = 0;
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        do {
          if (uVar7 == uVar3) {
            for (iVar2 = 0; iVar2 <= nXVars; iVar2 = iVar2 + 1) {
              fputc(0x20,(FILE *)Output);
            }
            fputc(0x2b,(FILE *)Output);
            for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              fputc(0x2d,(FILE *)Output);
              if (uVar11 != uVar3) {
                fputc(0x2b,(FILE *)Output);
              }
            }
            fputc(0x2b,(FILE *)Output);
            fputc(10,(FILE *)Output);
            return;
          }
          uVar13 = uVar7 >> 1 ^ uVar7;
          for (iVar14 = -1; iVar2 + iVar14 != -1; iVar14 = iVar14 + -1) {
            fputc(((uVar13 >> (nXVars + iVar14 & 0x1fU) & 1) != 0) + 0x30,(FILE *)Output);
          }
          fputc(0x20,(FILE *)Output);
          n = Extra_bddBitsToCube(dd,uVar13,nXVars,XVars,1);
          Cudd_Ref(n);
          fputc(0x7c,(FILE *)Output);
          for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
            fputc(0x20,(FILE *)Output);
            pDVar5 = Extra_bddBitsToCube(dd,uVar13 >> 1 ^ uVar13,nYVars,YVars,1);
            Cudd_Ref(pDVar5);
            pDVar6 = Cudd_bddAnd(dd,pDVar5,n);
            Cudd_Ref(pDVar6);
            Cudd_RecursiveDeref(dd,pDVar5);
            n_00 = Cudd_Cofactor(dd,OnSet,pDVar6);
            Cudd_Ref(n_00);
            n_01 = Cudd_Cofactor(dd,OffSet,pDVar6);
            Cudd_Ref(n_01);
            Cudd_RecursiveDeref(dd,pDVar6);
            pDVar5 = dd->one;
            pDVar6 = (DdNode *)((ulong)pDVar5 ^ 1);
            if (((((n_00 != pDVar5) || (iVar14 = 0x31, n_01 != pDVar6)) &&
                 ((n_01 != pDVar5 || (iVar14 = 0x20, n_00 != pDVar6)))) &&
                ((n_00 != pDVar6 || (iVar14 = 0x2d, n_01 != pDVar6)))) &&
               ((n_00 != pDVar5 || (iVar14 = 0x3f, n_01 != pDVar5)))) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/extrab/extraBddKmap.c"
                            ,0x2d9,
                            "void Extra_PrintKMapRelation(FILE *, DdManager *, DdNode *, DdNode *, int, int, DdNode **, DdNode **)"
                           );
            }
            fputc(iVar14,(FILE *)Output);
            Cudd_RecursiveDeref(dd,n_00);
            Cudd_RecursiveDeref(dd,n_01);
            fputc(0x20,(FILE *)Output);
            if (uVar11 != uVar13) {
              fputc(0x7c,(FILE *)Output);
            }
          }
          fputc(0x7c,(FILE *)Output);
          fputc(10,(FILE *)Output);
          Cudd_RecursiveDeref(dd,n);
          if (uVar7 != uVar9) {
            for (iVar14 = 0; iVar14 <= nXVars; iVar14 = iVar14 + 1) {
              fputc(0x20,(FILE *)Output);
            }
            fputc(0x2b,(FILE *)Output);
            if ((uVar7 & 1) == 0) {
              for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
                fputc(0x2d,(FILE *)Output);
                fputc(0x2d,(FILE *)Output);
                fputc(0x2d,(FILE *)Output);
                if (uVar11 != uVar13) {
                  fputc(0x2b,(FILE *)Output);
                }
              }
            }
            else {
              for (uVar13 = 0; uVar4 != uVar13; uVar13 = uVar13 + 1) {
                fputc(0x2d,(FILE *)Output);
                fputc(0x2d,(FILE *)Output);
                fputc(0x2d,(FILE *)Output);
                if (uVar11 != uVar13) {
                  fputc(0x2b,(FILE *)Output);
                }
              }
            }
            fputc(0x2b,(FILE *)Output);
            fputc(10,(FILE *)Output);
          }
          uVar7 = uVar7 + 1;
        } while( true );
      }
      pcVar8 = "PrintKMap(): Constant 0\n";
    }
    sStack_a0 = 0x18;
  }
  fwrite(pcVar8,sStack_a0,1,(FILE *)Output);
  return;
}

Assistant:

void Extra_PrintKMapRelation( 
  FILE * Output,  /* the output stream */
  DdManager * dd, 
  DdNode * OnSet, 
  DdNode * OffSet, 
  int nXVars, 
  int nYVars, 
  DdNode ** XVars, 
  DdNode ** YVars ) /* the flag which determines how support is computed */
{
    int d, p, n, s, v, h, w;
    int nVars;
    int nVarsVer;
    int nVarsHor;
    int nCellsVer;
    int nCellsHor;
    int nSkipSpaces;

    // make sure that on-set and off-set do not overlap
    if ( !Cudd_bddLeq( dd, OnSet, Cudd_Not(OffSet) ) )
    {
        fprintf( Output, "PrintKMap(): The on-set and the off-set overlap\n" );
        return;
    }

    if ( OnSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 1\n" );
        return;
    }
    if ( OffSet == b1 )
    {
        fprintf( Output, "PrintKMap(): Constant 0\n" );
        return;
    }

    nVars = nXVars + nYVars;
    if ( nVars < 0 || nVars > MAXVARS )
    {
        fprintf( Output, "PrintKMap(): The number of variables is less than zero or more than %d\n", MAXVARS );
        return;
    }


    ////////////////////////////////////////////////////////////////////
    // determine the Karnaugh map parameters
    nVarsVer = nXVars;
    nVarsHor = nYVars;
    nCellsVer = (1<<nVarsVer);
    nCellsHor = (1<<nVarsHor);
    nSkipSpaces = nVarsVer + 1;

    ////////////////////////////////////////////////////////////////////
    // print variable names
    fprintf( Output, "\n" );
    for ( w = 0; w < nVarsVer; w++ )
        fprintf( Output, "%c", 'a'+nVarsHor+w );
    if ( fHorizontalVarNamesPrintedAbove )
    {
        fprintf( Output, " \\ " );
        for ( w = 0; w < nVarsHor; w++ )
            fprintf( Output, "%c", 'a'+w );
    }
    fprintf( Output, "\n" );

    if ( fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );
            fprintf( Output, "\n" );
        }
    }

    ////////////////////////////////////////////////////////////////////
    // print the upper line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_TOP_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_BOT );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_BOT );
        }
    }
    fprintf( Output, "%c", DOUBLE_TOP_RIGHT );
    fprintf( Output, "\n" );

    ////////////////////////////////////////////////////////////////////
    // print the map
    for ( v = 0; v < nCellsVer; v++ )
    {
        DdNode * CubeVerBDD;

        // print horizontal digits
//      for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
        for ( n = 0; n < nVarsVer; n++ )
            if ( GrayCode(v) & (1<<(nVarsVer-1-n)) )
                fprintf( Output, "1" );
            else
                fprintf( Output, "0" );
        fprintf( Output, " " );

        // find vertical cube
//      CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nVarsVer, s_XVars+nVarsHor );    Cudd_Ref( CubeVerBDD );
        CubeVerBDD = Extra_bddBitsToCube( dd, GrayCode(v), nXVars, XVars, 1 );                 Cudd_Ref( CubeVerBDD );

        // print text line
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        for ( h = 0; h < nCellsHor; h++ )
        {
            DdNode * CubeHorBDD, * Prod, * ValueOnSet, * ValueOffSet;

            fprintf( Output, " " );
//          fprintf( Output, "x" );
            ///////////////////////////////////////////////////////////////
            // determine what should be printed
//          CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nVarsHor, s_XVars );    Cudd_Ref( CubeHorBDD );
            CubeHorBDD  = Extra_bddBitsToCube( dd, GrayCode(h), nYVars, YVars, 1 );        Cudd_Ref( CubeHorBDD );
            Prod = Cudd_bddAnd( dd, CubeHorBDD, CubeVerBDD );                           Cudd_Ref( Prod );
            Cudd_RecursiveDeref( dd, CubeHorBDD );

            ValueOnSet  = Cudd_Cofactor( dd, OnSet, Prod );                     Cudd_Ref( ValueOnSet );
            ValueOffSet = Cudd_Cofactor( dd, OffSet, Prod );                    Cudd_Ref( ValueOffSet );
            Cudd_RecursiveDeref( dd, Prod );

            if ( ValueOnSet == b1 && ValueOffSet == b0 )
                fprintf( Output, "%c", SYMBOL_ONE );
            else if ( ValueOnSet == b0 && ValueOffSet == b1 )
                fprintf( Output, "%c", SYMBOL_ZERO );
            else if ( ValueOnSet == b0 && ValueOffSet == b0 ) 
                fprintf( Output, "%c", SYMBOL_DC );
            else if ( ValueOnSet == b1 && ValueOffSet == b1 ) 
                fprintf( Output, "%c", SYMBOL_OVERLAP );
            else
                assert(0);

            Cudd_RecursiveDeref( dd, ValueOnSet );
            Cudd_RecursiveDeref( dd, ValueOffSet );
            ///////////////////////////////////////////////////////////////
            fprintf( Output, " " );

            if ( h != nCellsHor-1 )
            {
                if ( h&1 )
                    fprintf( Output, "%c", DOUBLE_VERTICAL );
                else
                    fprintf( Output, "%c", SINGLE_VERTICAL );
            }
        }
        fprintf( Output, "%c", DOUBLE_VERTICAL );
        fprintf( Output, "\n" );

        Cudd_RecursiveDeref( dd, CubeVerBDD );

        if ( v != nCellsVer-1 )
        // print separator line
        {
            for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
            if ( v&1 )
            {
                fprintf( Output, "%c", D_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    fprintf( Output, "%c", DOUBLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", DOUBLES_CROSS );
                        else
                            fprintf( Output, "%c", S_VER_CROSS_D_HOR );
                    }
                }
                fprintf( Output, "%c", D_JOINS_D_VER_LEFT );
            }
            else
            {
                fprintf( Output, "%c", S_JOINS_D_VER_RIGHT );
                for ( s = 0; s < nCellsHor; s++ )
                {
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    fprintf( Output, "%c", SINGLE_HORIZONTAL );
                    if ( s != nCellsHor-1 )
                    {
                        if ( s&1 )
                            fprintf( Output, "%c", S_HOR_CROSS_D_VER );
                        else
                            fprintf( Output, "%c", SINGLES_CROSS );
                    }
                }
                fprintf( Output, "%c", S_JOINS_D_VER_LEFT );
            }
            fprintf( Output, "\n" );
        }
    }
    
    ////////////////////////////////////////////////////////////////////
    // print the lower line
    for ( p = 0; p < nSkipSpaces; p++, fprintf( Output, " " ) );
    fprintf( Output, "%c", DOUBLE_BOT_LEFT );
    for ( s = 0; s < nCellsHor; s++ )
    {
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        fprintf( Output, "%c", DOUBLE_HORIZONTAL );
        if ( s != nCellsHor-1 )
        {
            if ( s&1 )
                fprintf( Output, "%c", D_JOINS_D_HOR_TOP );
            else
                fprintf( Output, "%c", S_JOINS_D_HOR_TOP );
        }
    }
    fprintf( Output, "%c", DOUBLE_BOT_RIGHT );
    fprintf( Output, "\n" );

    if ( !fHorizontalVarNamesPrintedAbove )
    {
        ////////////////////////////////////////////////////////////////////
        // print horizontal digits
        for ( d = 0; d < nVarsHor; d++ )
        {
            for ( p = 0; p < nSkipSpaces + 2; p++, fprintf( Output, " " ) );
            for ( n = 0; n < nCellsHor; n++ )
                if ( GrayCode(n) & (1<<(nVarsHor-1-d)) )
                    fprintf( Output, "1   " );
                else
                    fprintf( Output, "0   " );

            /////////////////////////////////
            fprintf( Output, "%c", (char)('a'+d) );
            /////////////////////////////////
            fprintf( Output, "\n" );
        }
    }
}